

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::FileDescriptor::Dump(FileDescriptor *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_98 [128];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  GenericDescriptor::Dump(&this->super_GenericDescriptor,stream);
  if ((this->LinkedTrackID).m_has_value == true) {
    fprintf((FILE *)stream,"  %22s = %d\n","LinkedTrackID",(ulong)(this->LinkedTrackID).m_property);
  }
  snprintf(local_98,0x80,"%d/%d",(ulong)(uint)(this->SampleRate).super_Rational.Numerator,
           (ulong)(uint)(this->SampleRate).super_Rational.Denominator);
  fprintf((FILE *)stream,"  %22s = %s\n","SampleRate",local_98);
  if ((this->ContainerDuration).m_has_value == true) {
    snprintf(local_98,0x40,"%lld",(this->ContainerDuration).m_property);
    fprintf((FILE *)stream,"  %22s = %s\n","ContainerDuration",local_98);
  }
  pcVar1 = UL::EncodeString(&this->EssenceContainer,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","EssenceContainer",pcVar1);
  if ((this->Codec).m_has_value == true) {
    pcVar1 = UL::EncodeString(&(this->Codec).m_property,local_98,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","Codec",pcVar1);
  }
  return;
}

Assistant:

void
FileDescriptor::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  GenericDescriptor::Dump(stream);
  if ( ! LinkedTrackID.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "LinkedTrackID", LinkedTrackID.get());
  }
  fprintf(stream, "  %22s = %s\n",  "SampleRate", SampleRate.EncodeString(identbuf, IdentBufferLen));
  if ( ! ContainerDuration.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "ContainerDuration", i64sz(ContainerDuration.get(), identbuf));
  }
  fprintf(stream, "  %22s = %s\n",  "EssenceContainer", EssenceContainer.EncodeString(identbuf, IdentBufferLen));
  if ( ! Codec.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Codec", Codec.get().EncodeString(identbuf, IdentBufferLen));
  }
}